

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContextData.h
# Opt level: O1

void __thiscall
uWS::WebSocketContextData<false>::WebSocketContextData(WebSocketContextData<false> *this)

{
  Loop *pLVar1;
  long lVar2;
  WebSocketContextData<false> *local_70;
  type local_68;
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_> local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  (this->messageHandler).erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
       ::empty_invoker<true>::invoke;
  (this->messageHandler).erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
       ::empty_cmd;
  (this->drainHandler).erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*)>::empty_invoker<true>::invoke;
  (this->drainHandler).erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>::
       empty_cmd;
  (this->closeHandler).erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
       ::empty_invoker<true>::invoke;
  (this->closeHandler).erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
       ::empty_cmd;
  (this->pingHandler).erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*)>::empty_invoker<true>::invoke;
  (this->pingHandler).erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>::
       empty_cmd;
  (this->pongHandler).erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*)>::empty_invoker<true>::invoke;
  (this->pongHandler).erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>::
       empty_cmd;
  this->maxPayloadLength = 0;
  this->idleTimeout = 0;
  this->maxBackpressure = 0;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:60:40)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:60:40)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  TopicTree::TopicTree
            (&this->topicTree,
             (function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
              *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  pLVar1 = Loop::get((void *)0x0);
  local_58.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::function_trait<void_(uWS::Loop_*)>::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:92:43),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:92:43)>_>,_true>
       ::invoke;
  local_58.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:92:43),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:92:43)>_>_>
       ::process_cmd<true>;
  local_70 = this;
  local_68.accessor_ = (data_accessor)this;
  lVar2 = us_loop_ext(pLVar1);
  std::
  _Rb_tree<void*,std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>,std::_Select1st<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>,std::less<void*>,std::allocator<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>>
  ::
  _M_emplace_unique<void*&,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>
            ((_Rb_tree<void*,std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>,std::_Select1st<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>,std::less<void*>,std::allocator<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>>
              *)(lVar2 + 0x60),&local_70,
             (function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
              *)&local_68);
  (*local_58.cmd_)(&local_58,op_weak_destroy,&local_68.accessor_,0x10,(data_accessor *)0x0,0);
  pLVar1 = Loop::get((void *)0x0);
  local_58.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::function_trait<void_(uWS::Loop_*)>::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:97:42),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:97:42)>_>,_true>
       ::invoke;
  local_58.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:97:42),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/incppect/third_party/uWebSockets/src/WebSocketContextData.h:97:42)>_>_>
       ::process_cmd<true>;
  local_70 = this;
  local_68.accessor_ = (data_accessor)this;
  lVar2 = us_loop_ext(pLVar1);
  std::
  _Rb_tree<void*,std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>,std::_Select1st<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>,std::less<void*>,std::allocator<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>>
  ::
  _M_emplace_unique<void*&,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>
            ((_Rb_tree<void*,std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>,std::_Select1st<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>,std::less<void*>,std::allocator<std::pair<void*const,fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void(uWS::Loop*)>>>>>
              *)(lVar2 + 0x90),&local_70,
             (function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
              *)&local_68);
  (*local_58.cmd_)(&local_58,op_weak_destroy,&local_68.accessor_,0x10,(data_accessor *)0x0,0);
  return;
}

Assistant:

WebSocketContextData() : topicTree([this](Subscriber *s, std::pair<std::string_view, std::string_view> data) -> int {
        /* We rely on writing to regular asyncSockets */
        auto *asyncSocket = (AsyncSocket<SSL> *) s->user;

        /* Check if we now have too much backpressure (todo: don't buffer up before check) */
        if (!maxBackpressure || (unsigned int) asyncSocket->getBufferedAmount() < maxBackpressure) {
            /* Pick uncompressed data track */
            std::string_view selectedData = data.first;

            /* Are we using compression? Fine, pick the compressed data track */
            WebSocketData *webSocketData = (WebSocketData *) asyncSocket->getAsyncSocketData();
            if (webSocketData->compressionStatus != WebSocketData::CompressionStatus::DISABLED) {
                selectedData = data.second;
            }

            /* Note: this assumes we are not corked, as corking will swallow things and fail later on */
            auto [written, failed] = asyncSocket->write(selectedData.data(), (int) selectedData.length());
            if (!failed) {
                asyncSocket->timeout(this->idleTimeout);
            }
            
            /* Failing here must not immediately close the socket, as that could result in stack overflow,
             * iterator invalidation and other TopicTree::drain bugs. We may shutdown the reading side of the socket,
             * causing next iteration to error-close the socket from that context instead, if we want to */
        }
        
        /* If we have too much backpressure, simply skip sending from here */

        /* Reserved, unused */
        return 0;
    }) {
        /* We empty for both pre and post just to make sure */
        Loop::get()->addPostHandler(this, [this](Loop *loop) {
            /* Commit pub/sub batches every loop iteration */
            topicTree.drain();
        });

        Loop::get()->addPreHandler(this, [this](Loop *loop) {
            /* Commit pub/sub batches every loop iteration */
            topicTree.drain();
        });
    }